

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cpp
# Opt level: O0

status_t __thiscall libchars::commands::sort(commands *this)

{
  type_t tVar1;
  id_t iVar2;
  id_t iVar3;
  __type _Var4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  string *psVar8;
  debug *pdVar9;
  token *ptVar10;
  char *pcVar11;
  token *this_00;
  bool bVar12;
  double dVar13;
  double __x;
  double __x_00;
  token *local_150;
  parameter *P_4;
  token *t_head;
  parameter *P_3;
  size_t n_arguments;
  parameter *P_2;
  size_t n_po;
  size_t n_pm;
  parameter *P_1;
  parameter *P;
  parameters_t par;
  token *T;
  size_t n_available;
  size_t n_assigned;
  size_t p_idx;
  commands *this_local;
  
  if (this->cmd == (command *)0x0) {
    this_local._4_4_ = NO_COMMAND;
  }
  else {
    n_available = 0;
    T = (token *)0x0;
    par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::vector
              ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)&P,
               &this->cmd->par);
    for (par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)this->t_par;
        par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0;
        par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((par.
                        super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).next) {
      T = (token *)&(T->value).field_0x1;
      if ((((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status & 0x500) == 0)
      {
        for (n_assigned = 0;
            sVar6 = std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::size
                              ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)
                               &P), n_assigned < sVar6; n_assigned = n_assigned + 1) {
          pvVar7 = std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::
                   operator[]((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)
                              &P,n_assigned);
          if ((((pvVar7->super_token).status & 0x100) == 0) && ((pvVar7->super_token).ttype == FLAG)
             ) {
            _Var4 = std::operator==(&(pvVar7->super_token).name,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)par.
                                       super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (_Var4) {
              ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status =
                   ((par.
                     super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status | 0x110
              ;
              ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).ttype = FLAG;
              std::__cxx11::string::operator=
                        ((string *)
                         &((par.
                            super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).name,
                         (string *)&(pvVar7->super_token).name);
              ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).ID =
                   (pvVar7->super_token).ID;
              std::__cxx11::string::clear();
              (pvVar7->super_token).status = (pvVar7->super_token).status | 0x100;
              n_available = n_available + 1;
              break;
            }
            psVar8 = (string *)std::__cxx11::string::length();
            iVar5 = std::__cxx11::string::compare((ulong)&(pvVar7->super_token).name,0,psVar8);
            if (iVar5 == 0) {
              ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status =
                   ((par.
                     super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status | 4;
            }
          }
        }
      }
    }
    for (par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)this->t_par;
        par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0;
        par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((par.
                        super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).next) {
      if ((((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status & 0x500) == 0)
      {
        for (n_assigned = 0;
            sVar6 = std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::size
                              ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)
                               &P), n_assigned < sVar6; n_assigned = n_assigned + 1) {
          pvVar7 = std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::
                   operator[]((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)
                              &P,n_assigned);
          if ((((pvVar7->super_token).status & 0x100) == 0) && ((pvVar7->super_token).ttype == KEY))
          {
            _Var4 = std::operator==(&(pvVar7->super_token).name,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)par.
                                       super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (_Var4) {
              ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status =
                   ((par.
                     super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status &
                   0xfffffffb;
              ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status =
                   ((par.
                     super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status | 0x110
              ;
              ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).ttype = KEY;
              std::__cxx11::string::operator=
                        ((string *)
                         &((par.
                            super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).name,
                         (string *)&(pvVar7->super_token).name);
              ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).ID =
                   (pvVar7->super_token).ID;
              if (((par.
                    super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).next ==
                  (token *)0x0) {
                pdVar9 = debug::initialize(0);
                dVar13 = (double)std::__cxx11::string::c_str();
                debug::log(pdVar9,dVar13);
                std::__cxx11::string::clear();
                this_local._4_4_ = MISSING_VALUE;
                goto LAB_001386b3;
              }
              if (((((par.
                      super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).next)->status
                  & 0x100) != 0) {
                pdVar9 = debug::initialize(0);
                dVar13 = (double)std::__cxx11::string::c_str();
                debug::log(pdVar9,dVar13);
                std::__cxx11::string::clear();
                this_local._4_4_ = MISSING_VALUE;
                goto LAB_001386b3;
              }
              std::__cxx11::string::clear();
              par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((par.
                              super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).next
              ;
              ((token *)
              par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)->status =
                   ((token *)
                   par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->status | 0x910;
              ((token *)
              par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)->ttype = KEY;
              std::__cxx11::string::operator=
                        ((string *)
                         &((token *)
                          par.
                          super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->name,
                         (string *)&(pvVar7->super_token).name);
              ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).ID =
                   (pvVar7->super_token).ID;
              ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).vtype =
                   (pvVar7->super_token).vtype;
              (pvVar7->super_token).status = (pvVar7->super_token).status | 0x100;
              n_available = n_available + 2;
              break;
            }
            psVar8 = (string *)std::__cxx11::string::length();
            iVar5 = std::__cxx11::string::compare((ulong)&(pvVar7->super_token).name,0,psVar8);
            if (iVar5 == 0) {
              ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status =
                   ((par.
                     super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status | 4;
            }
          }
        }
      }
    }
    n_po = 0;
    for (n_assigned = 0;
        sVar6 = std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::size
                          ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)&P),
        n_assigned < sVar6; n_assigned = n_assigned + 1) {
      pvVar7 = std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::operator[]
                         ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)&P,
                          n_assigned);
      tVar1 = (pvVar7->super_token).ttype;
      if (tVar1 == KEY) {
        if (((pvVar7->super_token).status & 0x1100) == 0x1000) {
          pdVar9 = debug::initialize(0);
          dVar13 = (double)std::__cxx11::string::c_str();
          debug::log(pdVar9,dVar13);
          this_local._4_4_ = TOO_FEW_ARGS;
          goto LAB_001386b3;
        }
      }
      else if ((tVar1 == VALUE) && (((pvVar7->super_token).status & 0x1000) != 0)) {
        n_po = n_po + 1;
      }
    }
    P_3 = (parameter *)((long)T - n_available);
    n_assigned = 0;
    par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this->t_par;
    while (P_3 != (parameter *)0x0 &&
           par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      while( true ) {
        bVar12 = false;
        if (par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          bVar12 = (((par.
                      super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status &
                   0x100) != 0;
        }
        if (!bVar12) break;
        par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((par.
                        super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).next;
      }
      if (par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)0x0) break;
      while( true ) {
        sVar6 = std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::size
                          ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)&P);
        bVar12 = false;
        if (n_assigned < sVar6) {
          pvVar7 = std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::
                   operator[]((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)
                              &P,n_assigned);
          bVar12 = true;
          if (((pvVar7->super_token).status & 0x100) == 0) {
            pvVar7 = std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::
                     operator[]((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *
                                )&P,n_assigned);
            bVar12 = (pvVar7->super_token).ttype != VALUE;
          }
        }
        if (!bVar12) break;
        n_assigned = n_assigned + 1;
      }
      sVar6 = std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::size
                        ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)&P);
      if (sVar6 <= n_assigned) break;
      pvVar7 = std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::operator[]
                         ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)&P,
                          n_assigned);
      ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->super_token).status =
           ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status | 0x910;
      ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->super_token).ttype = VALUE;
      ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->super_token).vtype = (pvVar7->super_token).vtype
      ;
      ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->super_token).ID = (pvVar7->super_token).ID;
      (pvVar7->super_token).status = (pvVar7->super_token).status | 0x100;
      P_3 = (parameter *)((long)&P_3[-1].super_token.next + 7);
      if (((pvVar7->super_token).status & 0x1000) != 0) {
        n_po = n_po - 1;
      }
    }
    par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this->t_par;
    while (par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      while( true ) {
        bVar12 = false;
        if (par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          bVar12 = (((par.
                      super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status &
                   0x100) != 0;
        }
        if (!bVar12) break;
        par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((par.
                        super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).next;
      }
      if (par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)0x0) break;
      ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->super_token).status =
           ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status | 0x110;
      if ((((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status & 4) == 0) {
        ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)->super_token).status =
             ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).status | 2;
      }
      ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->super_token).ttype = UNKNOWN;
    }
    if (P_3 == (parameter *)0x0) {
      if (n_po == 0) {
        if (this->t_par == (token *)0x0) {
          local_150 = this->t_cmd;
        }
        else {
          local_150 = this->t_par;
        }
        P_4 = (parameter *)local_150;
        while( true ) {
          bVar12 = false;
          if (P_4 != (parameter *)0x0) {
            bVar12 = (P_4->super_token).next != (token *)0x0;
          }
          if (!bVar12) break;
          P_4 = (parameter *)(P_4->super_token).next;
        }
        if (P_4 != (parameter *)0x0) {
          for (n_assigned = 0;
              sVar6 = std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::size
                                ((vector<libchars::parameter,_std::allocator<libchars::parameter>_>
                                  *)&P), n_assigned < sVar6; n_assigned = n_assigned + 1) {
            psVar8 = (string *)
                     std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::
                     operator[]((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *
                                )&P,n_assigned);
            if ((*(uint *)(psVar8 + 0x6c) & 0x8100) == 0x8000) {
              if (*(int *)(psVar8 + 0x40) == 2) {
                ptVar10 = (token *)operator_new(0x90);
                tVar1 = *(type_t *)(psVar8 + 0x40);
                iVar2 = *(id_t *)(psVar8 + 0x68);
                iVar3 = *(id_t *)(psVar8 + 0x70);
                pcVar11 = (char *)std::__cxx11::string::c_str();
                token::token(ptVar10,tVar1,iVar2,iVar3,pcVar11);
                ptVar10->status = ptVar10->status | 0x100;
                (P_4->super_token).next = ptVar10;
                if (this->t_par == (token *)0x0) {
                  this->t_par = ptVar10;
                }
                par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ptVar10;
                this_00 = (token *)operator_new(0x90);
                tVar1 = *(type_t *)(psVar8 + 0x40);
                iVar2 = *(id_t *)(psVar8 + 0x68);
                iVar3 = *(id_t *)(psVar8 + 0x70);
                pcVar11 = (char *)std::__cxx11::string::c_str();
                token::token(this_00,tVar1,iVar2,iVar3,pcVar11);
                this_00->status = this_00->status | 0x4900;
                par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
                std::__cxx11::string::operator=((string *)this_00,psVar8);
                ptVar10->next =
                     &(par.
                       super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token;
                P_4 = par.
                      super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
              }
              else if (*(int *)(psVar8 + 0x40) == 3) {
                ptVar10 = (token *)operator_new(0x90);
                token::token(ptVar10,*(type_t *)(psVar8 + 0x40),*(id_t *)(psVar8 + 0x68),
                             *(id_t *)(psVar8 + 0x70),(char *)0x0);
                ptVar10->status = ptVar10->status | 0x4100;
                par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ptVar10;
                std::__cxx11::string::operator=((string *)ptVar10,psVar8);
                (P_4->super_token).next =
                     &(par.
                       super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token;
                P_4 = par.
                      super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
                if (this->t_par == (token *)0x0) {
                  this->t_par = &(par.
                                  super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token;
                }
              }
            }
          }
        }
        this_local._4_4_ = VALID_COMMAND;
      }
      else {
        pdVar9 = debug::initialize(0);
        debug::log(pdVar9,__x_00);
        this_local._4_4_ = TOO_FEW_ARGS;
      }
    }
    else {
      pdVar9 = debug::initialize(0);
      debug::log(pdVar9,__x);
      this_local._4_4_ = TOO_MANY_ARGS;
    }
LAB_001386b3:
    std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::~vector
              ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)&P);
  }
  return this_local._4_4_;
}

Assistant:

commands::status_t commands::sort()
    {
        if (cmd == NULL)
            return NO_COMMAND;

        size_t p_idx = 0;
        size_t n_assigned = 0;
        size_t n_available = 0;
        token *T = NULL;
        parameters_t par = cmd->par;

        // find FLAG parameters
        T = t_par;
        while (T != NULL) {
            ++n_available;
            if ((T->status & (token::IS_QUOTED | token::SORTED)) == 0) {
                for (p_idx = 0; p_idx < par.size(); ++p_idx) {
                    parameter &P = par[p_idx];
                    if (!(P.status & token::SORTED) && P.ttype == token::FLAG) {
                        if (P.name == T->value) {
                            // full match on flag name
                            T->status |= (token::SORTED | token::IN_STRING);
                            T->ttype = token::FLAG;
                            T->name = P.name;
                            T->ID = P.ID;
                            T->value.clear();
                            P.status |= token::SORTED;
                            ++n_assigned;
                            break;
                        }
                        else if (P.name.compare(0, T->value.length(), T->value) == 0) {
                            // partial match on flag name
                            T->status |= token::PARTIAL_ARG;
                        }
                    }
                }
            }
            T = T->next;
        }

        // find values for KEY parameters; error if corresponding value not available
        T = t_par;
        while (T != NULL) {
            if ((T->status & (token::IS_QUOTED | token::SORTED)) == 0) {
                for (p_idx = 0; p_idx < par.size(); ++p_idx) {
                    parameter &P = par[p_idx];
                    if (!(P.status & token::SORTED) && P.ttype == token::KEY) {
                        if (P.name == T->value) {
                            // full match on key name
                            T->status &= ~token::PARTIAL_ARG;
                            T->status |= (token::SORTED | token::IN_STRING);
                            T->ttype = token::KEY;
                            T->name = P.name;
                            T->ID = P.ID;
                            if (T->next == NULL) {
                                LC_LOG_VERBOSE("KEY(%s): missing value", P.name.c_str());
                                T->value.clear();
                                return MISSING_VALUE;
                            }
                            else if (T->next->status & token::SORTED) {
                                LC_LOG_VERBOSE("KEY(%s): missing value", P.name.c_str());
                                T->value.clear();
                                return MISSING_VALUE;
                            }
                            else {
                                T->value.clear();
                                T = T->next;
                                T->status |= (token::SORTED | token::IN_STRING | token::IS_VALUE);
                                T->ttype = token::KEY;
                                T->name = P.name;
                                T->ID = P.ID;
                                T->vtype = P.vtype;
                                P.status |= token::SORTED;
                                n_assigned += 2;
                                break;
                            }
                        }
                        else if (P.name.compare(0, T->value.length(), T->value) == 0) {
                            // partial match on key name
                            T->status |= token::PARTIAL_ARG;
                        }
                    }
                }
            }
            T = T->next;
        }

        // make sure all mandatory KEY parameters were specified
        size_t n_pm = 0, n_po = 0;
        for (p_idx = 0; p_idx < par.size(); ++p_idx) {
            parameter &P = par[p_idx];
            switch (P.ttype) {
            case token::KEY:
                if ((P.status & (token::SORTED | token::MANDATORY)) == token::MANDATORY) {
                    LC_LOG_VERBOSE("KEY(%s): missing key", P.name.c_str());
                    return TOO_FEW_ARGS;
                }
                break;
            case token::VALUE:
                if (P.status & token::MANDATORY) {
                    ++n_pm;
                }
                else {
                    ++n_po;
                }
                break;
            default:;
            }
        }

        // extract positional arguments (type = VALUE)
        size_t n_arguments = n_available - n_assigned;
        p_idx = 0;
        T = t_par;
        while (n_arguments > 0 && T != NULL) {
            while (T != NULL && (T->status & token::SORTED))
                T = T->next;
            if (T == NULL)
                break;
            while (p_idx < par.size() && ((par[p_idx].status & token::SORTED) || par[p_idx].ttype != token::VALUE))
                ++p_idx;
            if (p_idx >= par.size())
                break;
            parameter& P = par[p_idx];
            T->status |= (token::SORTED | token::IN_STRING | token::IS_VALUE);
            T->ttype = token::VALUE;
            T->vtype = P.vtype;
            T->ID = P.ID;
            P.status |= token::SORTED;
            --n_arguments;
            if (P.status & token::MANDATORY) --n_pm; else --n_po;
        }

        // mark remaining arguments as invalid (if not a partial key match)
        T = t_par;
        while (T != NULL) {
            while (T != NULL && (T->status & token::SORTED))
                T = T->next;
            if (T == NULL)
                break;
            T->status |= (token::SORTED | token::IN_STRING);
            if (!(T->status & token::PARTIAL_ARG))
                T->status |= token::INVALID;
            T->ttype = token::UNKNOWN;
        }

        if (n_arguments > 0) {
            LC_LOG_VERBOSE("Too many arguments [%zu extra]",n_arguments);
            return TOO_MANY_ARGS;
        }
        else if (n_pm > 0) {
            LC_LOG_VERBOSE("Missing mandatory arguments [%zu remain]",n_pm);
            return TOO_FEW_ARGS;
        }

        // add unspecified optional parameters (with default values) to token list
        token *t_head = (t_par != NULL) ? t_par : t_cmd;
        while (t_head != NULL && t_head->next != NULL)
            t_head = t_head->next;

        if (t_head != NULL) {
            for (p_idx = 0; p_idx < par.size(); ++p_idx) {
                parameter &P = par[p_idx];
                if ((P.status & (token::SORTED | token::DEFAULT_SET)) == token::DEFAULT_SET) {
                    switch (P.ttype) {
                    case token::FLAG:
                        // missing flag = FALSE
                        break;
                    case token::VALUE:
                        T = new token(P.ttype,P.ID,P.vtype);
                        T->status |= (token::SORTED | token::DEFAULT_USED);
                        T->value = P.value;
                        t_head->next = T;
                        t_head = T;
                        if (t_par == NULL)
                            t_par = T;
                        break;
                    case token::KEY:
                        T = new token(P.ttype,P.ID,P.vtype,P.name.c_str());
                        T->status |= (token::SORTED);
                        t_head->next = T;
                        t_head = T;
                        if (t_par == NULL)
                            t_par = T;
                        T = new token(P.ttype,P.ID,P.vtype,P.name.c_str());
                        T->status |= (token::SORTED | token::IS_VALUE | token::DEFAULT_USED);
                        T->value = P.value;
                        t_head->next = T;
                        t_head = T;
                        break;
                    default:;
                    }
                }
            }
        }

        return VALID_COMMAND;
    }